

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackRemover.cpp
# Opt level: O3

void __thiscall phaeton::StackRemover::transformAssignments(StackRemover *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  AssignmentsListTy *pAVar4;
  IdentifierExpr *pIVar5;
  char cVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  _List_node_base *p_Var10;
  mapped_type *ppIVar11;
  _List_node_base *p_Var12;
  const_iterator cVar13;
  ExpressionNode *pEVar14;
  uint uVar15;
  ulong uVar16;
  long *plVar17;
  uint J;
  uint uVar18;
  string __str;
  ExprTreeLifter Lifter;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  _func_int **local_e0;
  _List_node_base *local_d8;
  IdentifierExpr *local_d0;
  value_type local_c8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_phaeton::IdentifierExpr_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_phaeton::IdentifierExpr_*>_>_>
  *local_a8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_a0;
  long *local_98;
  ExprDims *local_90;
  ExprTreeLifter local_88;
  
  local_88.CG = this->CG;
  local_108._M_unused._M_object = (code **)0x0;
  local_108._8_8_ = 0;
  local_f0 = std::
             _Function_handler<bool_(const_phaeton::ExpressionNode_*,_const_phaeton::ExpressionNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lijiansong[P]Phaeton/lib/Opt/StackRemover.cpp:95:35)>
             ::_M_invoke;
  local_f8 = std::
             _Function_handler<bool_(const_phaeton::ExpressionNode_*,_const_phaeton::ExpressionNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lijiansong[P]Phaeton/lib/Opt/StackRemover.cpp:95:35)>
             ::_M_manager;
  local_e0 = (_func_int **)&PTR_transformAddExpr_00161548;
  local_88.super_ExprTreeTransformer._vptr_ExprTreeTransformer =
       (_func_int **)&PTR_transformAddExpr_00161548;
  local_88.Assignments = &(local_88.CG)->Assignments;
  local_88.CurrentPos._M_node = (_List_node_base *)0x0;
  std::function<bool_(const_phaeton::ExpressionNode_*,_const_phaeton::ExpressionNode_*)>::function
            (&local_88.IsNodeToBeLifted,
             (function<bool_(const_phaeton::ExpressionNode_*,_const_phaeton::ExpressionNode_*)> *)
             &local_108);
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,3);
  }
  ExprTreeLifter::transformAssignments(&local_88);
  p_Var10 = (_List_node_base *)this->Assignments;
  p_Var12 = p_Var10->_M_next;
  (this->CurrentPos)._M_node = p_Var12;
  if (p_Var12 != p_Var10) {
    paVar2 = &local_c8.field_2;
    local_a8 = &this->Replacements;
    p_Var10 = p_Var12;
    do {
      plVar3 = (long *)(((AssignmentsListTy *)p_Var10)->
                       super__List_base<phaeton::CodeGen::Assignment,_std::allocator<phaeton::CodeGen::Assignment>_>
                       )._M_impl._M_node._M_size;
      plVar17 = *(long **)&((AssignmentsListTy *)((long)p_Var10 + 0x18))->
                           super__List_base<phaeton::CodeGen::Assignment,_std::allocator<phaeton::CodeGen::Assignment>_>
      ;
      cVar6 = (**(code **)(*plVar17 + 0x58))(plVar17);
      p_Var10 = ((this->CurrentPos)._M_node)->_M_next;
      if (cVar6 == '\0') {
        (this->CurrentPos)._M_node = p_Var10;
      }
      else {
        local_d8 = p_Var10;
        (**(code **)(*plVar3 + 0x38))(&local_108,plVar3);
        uVar18 = *(uint *)((long)plVar17 + 0xc);
        if (uVar18 != 0) {
          local_90 = (ExprDims *)(plVar3 + 5);
          local_a0 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(plVar3 + 0x10);
          uVar15 = 0;
          local_98 = plVar17;
          do {
            if ((int)uVar18 <= (int)uVar15) {
              __assert_fail("I < getNumChildren()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/lijiansong[P]Phaeton/include/ph/Opt/TensorExprTree.h"
                            ,0x41,"ExpressionNode *phaeton::ExpressionNode::getChild(int)");
            }
            pEVar14 = *(ExpressionNode **)(plVar17[2] + (long)(int)uVar15 * 8);
            local_d0 = ExpressionNodeBuilder::createIdentifierExpr
                                 (this->ExprNodeBuilder,(string *)&local_108,local_90);
            this_00 = &local_d0->Indices;
            for (uVar18 = 0; uVar8 = (**(code **)(*plVar3 + 0x48))(plVar3), uVar18 < uVar8;
                uVar18 = uVar18 + 1) {
              (**(code **)(*plVar3 + 0x40))(&local_c8,plVar3,uVar18);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(this_00,&local_c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != paVar2) {
                operator_delete(local_c8._M_dataplus._M_p);
              }
            }
            uVar18 = 1;
            if (9 < uVar15) {
              uVar16 = (ulong)uVar15;
              uVar8 = 4;
              do {
                uVar18 = uVar8;
                if (uVar16 < 100) {
                  uVar18 = uVar18 - 2;
                  goto LAB_0013b7a8;
                }
                if (uVar16 < 1000) {
                  uVar18 = uVar18 - 1;
                  goto LAB_0013b7a8;
                }
                if (uVar16 < 10000) goto LAB_0013b7a8;
                bVar7 = 99999 < uVar16;
                uVar16 = uVar16 / 10000;
                uVar8 = uVar18 + 4;
              } while (bVar7);
              uVar18 = uVar18 + 1;
            }
LAB_0013b7a8:
            local_c8._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct((ulong)&local_c8,(char)uVar18);
            std::__detail::__to_chars_10_impl<unsigned_long_long>
                      (local_c8._M_dataplus._M_p,uVar18,(ulong)uVar15);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(this_00,&local_c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != paVar2) {
              operator_delete(local_c8._M_dataplus._M_p);
            }
            plVar17 = local_98;
            pIVar5 = local_d0;
            if ((char)plVar3[0xf] == '\x01') {
              local_d0->Permute = true;
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator=(&local_d0->IndexPairs,local_a0);
            }
            iVar9 = (*pEVar14->_vptr_ExpressionNode[6])();
            if (((char)iVar9 == '\0') || (bVar7 = isDeclaredId(this,pEVar14), bVar7)) {
              pAVar4 = this->Assignments;
              p_Var10 = (_List_node_base *)operator_new(0x20);
              p_Var10[1]._M_next = (_List_node_base *)local_d0;
              p_Var10[1]._M_prev = (_List_node_base *)pEVar14;
              std::__detail::_List_node_base::_M_hook(p_Var10);
              psVar1 = &(pAVar4->
                        super__List_base<phaeton::CodeGen::Assignment,_std::allocator<phaeton::CodeGen::Assignment>_>
                        )._M_impl._M_node._M_size;
              *psVar1 = *psVar1 + 1;
            }
            else {
              (*pEVar14->_vptr_ExpressionNode[7])(&local_c8);
              ppIVar11 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_phaeton::IdentifierExpr_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_phaeton::IdentifierExpr_*>_>_>
                         ::operator[](local_a8,&local_c8);
              *ppIVar11 = pIVar5;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != paVar2) {
                operator_delete(local_c8._M_dataplus._M_p);
              }
            }
            uVar15 = uVar15 + 1;
            uVar18 = *(uint *)((long)plVar17 + 0xc);
          } while (uVar15 < uVar18);
        }
        p_Var10 = (this->CurrentPos)._M_node;
        psVar1 = &(this->Assignments->
                  super__List_base<phaeton::CodeGen::Assignment,_std::allocator<phaeton::CodeGen::Assignment>_>
                  )._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var10);
        (this->CurrentPos)._M_node = local_d8;
        p_Var10 = local_d8;
        if ((code **)local_108._M_unused._0_8_ != &local_f8) {
          operator_delete(local_108._M_unused._M_object);
          p_Var10 = (this->CurrentPos)._M_node;
        }
      }
    } while (p_Var10 != (_List_node_base *)this->Assignments);
    p_Var12 = (this->Assignments->
              super__List_base<phaeton::CodeGen::Assignment,_std::allocator<phaeton::CodeGen::Assignment>_>
              )._M_impl._M_node.super__List_node_base._M_next;
  }
  (this->CurrentPos)._M_node = p_Var12;
  if (p_Var12 != p_Var10) {
    do {
      pEVar14 = (ExpressionNode *)p_Var12[1]._M_next;
      iVar9 = (*pEVar14->_vptr_ExpressionNode[6])(pEVar14);
      if ((char)iVar9 == '\0') {
        __assert_fail("LHS->isIdentifier()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lijiansong[P]Phaeton/lib/Opt/StackRemover.cpp"
                      ,0xa0,"void phaeton::StackRemover::transformAssignments()");
      }
      (*pEVar14->_vptr_ExpressionNode[7])(&local_108,pEVar14);
      cVar13 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_phaeton::IdentifierExpr_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_phaeton::IdentifierExpr_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_phaeton::IdentifierExpr_*>_>_>
               ::find(&(this->Replacements)._M_t,(key_type *)&local_108);
      if ((code **)local_108._M_unused._0_8_ != &local_f8) {
        operator_delete(local_108._M_unused._M_object);
      }
      if ((_Rb_tree_header *)cVar13._M_node ==
          &(this->Replacements)._M_t._M_impl.super__Rb_tree_header) {
        p_Var10 = (this->CurrentPos)._M_node;
      }
      else {
        pEVar14 = buildReplacement(this,pEVar14,true);
        p_Var10 = (this->CurrentPos)._M_node;
        p_Var10[1]._M_next = (_List_node_base *)pEVar14;
      }
      p_Var10 = p_Var10[1]._M_prev;
      this->Parent = (ExpressionNode *)0x0;
      this->ChildIndex = -1;
      (*(code *)p_Var10->_M_next[2]._M_prev)(p_Var10,this);
      p_Var12 = ((this->CurrentPos)._M_node)->_M_next;
      (this->CurrentPos)._M_node = p_Var12;
    } while (p_Var12 != (_List_node_base *)this->Assignments);
  }
  local_88.super_ExprTreeTransformer._vptr_ExprTreeTransformer = local_e0;
  if (local_88.IsNodeToBeLifted.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_88.IsNodeToBeLifted.super__Function_base._M_manager)
              ((_Any_data *)&local_88.IsNodeToBeLifted,(_Any_data *)&local_88.IsNodeToBeLifted,
               __destroy_functor);
  }
  return;
}

Assistant:

void StackRemover::transformAssignments() {
  // 1. We need to lift all tensor stack expressions up to the top level.
  const auto &nodeLiftPredicate = [](const ExpressionNode *Node,
                                     const ExpressionNode *Root) {
    return Node->isStackExpr();
  };
  ExprTreeLifter Lifter(CG, nodeLiftPredicate);
  Lifter.transformAssignments();

  // 2. We need to find all stack expressions and remove them.
  CurrentPos = Assignments.begin();
  while (CurrentPos != Assignments.end()) {
    IdentifierExpr *LHS = static_cast<IdentifierExpr *>(CurrentPos->LHS);
    ExpressionNode *RHS = CurrentPos->RHS;

    if (!RHS->isStackExpr()) {
      ++CurrentPos;
      continue;
    }

    const auto NextPos = std::next(CurrentPos);
    const std::string &LHSName = LHS->getName();

    for (unsigned I = 0; I < RHS->getNumChildren(); ++I) {
      ExpressionNode *Child = RHS->getChild(I);

      // Note here we build 'LHS' for assigning the i-th child.
      IdentifierExpr *Id =
          ExprNodeBuilder->createIdentifierExpr(LHSName, LHS->getDims());
      for (unsigned J = 0; J < LHS->getNumIndices(); ++J) {
        Id->addIndex(LHS->getIndex(J));
      }
      Id->addIndex(std::to_string((long long)I));
      if (LHS->getPermute()) {
        Id->setPermute(true);
        Id->setIndexPairs(LHS->getIndexPairs());
      }

      if (Child->isIdentifier() && !isDeclaredId(Child)) {
        // The 'Child' node is an Identifier that has not been declared
        // explicitly in Phaeton program. Hence, this Identifier must have
        // been inserted by a transformation, here the transformation is
        // performed by lifting stack expressions to the top level. Therefore,
        // the Identifier only has a single use, i.e. inside the current stack
        // expression. Since the identifier has been inserted by a
        // transformation, it also has only one single definition.
        Replacements[Child->getName()] = Id;
      } else {
        // The assignemnt of the 'Child' node is inserted before next
        // assignment in Phaeton program. Since stacks have been lifted to the
        // top level, the expression tree rooted at 'Child' node does not
        // contain any stack expressions. Hence, current transformation
        // need not be applied recursively to the new assignment.
        Assignments.insert(NextPos, {Id, Child});
      }
    }

    Assignments.erase(CurrentPos);
    CurrentPos = NextPos;
  }

  // 3. Now we need to apply the replacements.
  for (CurrentPos = Assignments.begin(); CurrentPos != Assignments.end();
       ++CurrentPos) {
    // Here we handle replacements of defs, i.e. replacements on 'LHS'.
    {
      ExpressionNode *LHS = CurrentPos->LHS;
      assert(LHS->isIdentifier());
      if (Replacements.count(LHS->getName()))
        CurrentPos->LHS = buildReplacement(LHS, /* IsForLHS = */ true);
    }

    // Here we handle replacements of uses, i.e. replacements on 'RHS'.
    {
      ExpressionNode *RHS = CurrentPos->RHS;
      setParent(nullptr);
      setChildIndex(-1);
      RHS->transform(this);
    }
  }
}